

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void lts2::PerformBIHTOnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float sparsity,float patchMean)

{
  float patchMean_00;
  float sparsityCoeff;
  float iterations_00;
  _InputArray *p_Var1;
  Mat *LBD_00;
  int iVar2;
  double *pdVar3;
  undefined1 auVar4 [12];
  int local_650;
  int local_64c;
  Mat local_5f8 [96];
  Mat local_598 [8];
  Mat target;
  allocator local_531;
  string local_530 [32];
  Size_<int> local_510;
  _InputArray local_508;
  undefined1 local_4f0 [8];
  Scalar mean;
  undefined1 local_4c8 [4];
  float pmean;
  _OutputArray local_4b0 [4];
  undefined1 local_450 [8];
  Rect ROI;
  int x;
  int y;
  Mat resultPatch;
  Mat local_3d8 [8];
  Mat freak;
  Mat local_378 [8];
  Mat inputPatch;
  undefined1 local_318 [8];
  SignOperator A;
  MatExpr local_300 [352];
  MatExpr local_1a0 [8];
  Mat patchOnes;
  Scalar_<double> local_140;
  MatSize local_120 [8];
  undefined1 local_118 [8];
  Mat ocount;
  Scalar_<double> local_b8;
  _InputArray local_98;
  MatSize local_7c [8];
  undefined4 local_74;
  undefined8 local_70;
  allocator local_61;
  string local_60 [36];
  float local_3c;
  float local_38;
  float patchMean_local;
  float sparsity_local;
  int iterations_local;
  Mat *result_local;
  LBDOperator *LBD_local;
  Point *patchOffset_local;
  Size *patchSize_local;
  Mat *anImage_local;
  
  local_3c = patchMean;
  local_38 = sparsity;
  patchMean_local = (float)iterations;
  _sparsity_local = (_InputArray *)result;
  result_local = (Mat *)LBD;
  LBD_local = (LBDOperator *)patchOffset;
  patchOffset_local = (Point *)patchSize;
  patchSize_local = (Size *)anImage;
  iVar2 = cv::Mat::type(anImage);
  if ((iVar2 == 5) &&
     (iVar2 = cv::Mat::channels((Mat *)patchSize_local), p_Var1 = _sparsity_local, iVar2 == 1)) {
    cv::MatSize::operator()(local_7c);
    cv::Mat::create(p_Var1,local_7c,5);
    p_Var1 = _sparsity_local;
    cv::Scalar_<double>::Scalar_(&local_b8,0.0);
    cv::_InputArray::_InputArray<double,4,1>(&local_98,(Matx<double,_4,_1> *)&local_b8);
    cv::noArray();
    cv::Mat::setTo(p_Var1,&local_98);
    cv::_InputArray::~_InputArray(&local_98);
    cv::MatSize::operator()(local_120);
    cv::Scalar_<double>::Scalar_(&local_140,0.0);
    cv::Mat::Mat((Mat *)local_118,local_120,5,&local_140);
    cv::Size_<int>::Size_((Size_<int> *)&A.super_LinearOperator._norm,patchSize);
    cv::Mat::ones(local_300,&A.super_LinearOperator._norm,5);
    cv::MatExpr::operator_cast_to_Mat(local_1a0);
    cv::MatExpr::~MatExpr(local_300);
    SignOperator::SignOperator((SignOperator *)local_318);
    cv::Mat::Mat(local_378);
    cv::Mat::Mat(local_3d8);
    cv::Mat::Mat((Mat *)&x);
    if (patchOffset->x < 2) {
      local_64c = 1;
    }
    else {
      local_64c = patchOffset->x;
    }
    patchOffset->x = local_64c;
    if (patchOffset->y < 2) {
      local_650 = 1;
    }
    else {
      local_650 = patchOffset->y;
    }
    patchOffset->y = local_650;
    for (ROI.height = 0; ROI.height < patchSize_local[1].width;
        ROI.height = patchOffset->y + ROI.height) {
      for (ROI.width = 0; ROI.width < patchSize_local[1].height;
          ROI.width = patchOffset->x + ROI.width) {
        cv::Rect_<int>::Rect_
                  ((Rect_<int> *)local_450,ROI.width,ROI.height,patchSize->width,patchSize->height);
        if ((ROI.height + patchSize->height <= patchSize_local[1].width) &&
           (ROI.width + patchSize->width <= patchSize_local[1].height)) {
          cv::Mat::operator()((Mat *)local_4b0,(Rect *)patchSize_local);
          cv::_OutputArray::_OutputArray((_OutputArray *)local_4c8,local_378);
          cv::Mat::copyTo(local_4b0);
          cv::_OutputArray::~_OutputArray((_OutputArray *)local_4c8);
          cv::Mat::~Mat((Mat *)local_4b0);
          mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ = local_3c;
          if (local_3c < 0.0) {
            cv::_InputArray::_InputArray(&local_508,local_378);
            cv::noArray();
            cv::mean((_InputArray *)local_4f0,&local_508);
            cv::_InputArray::~_InputArray(&local_508);
            pdVar3 = cv::Vec<double,_4>::operator[]((Vec<double,_4> *)local_4f0,0);
            mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ = (float)*pdVar3;
          }
          (**(code **)(*(long *)result_local + 0x10))(result_local,local_378,local_3d8);
          SignOperator::Apply((SignOperator *)local_318,local_3d8,local_3d8);
          LBD_00 = result_local;
          iterations_00 = patchMean_local;
          sparsityCoeff = local_38;
          cv::Size_<int>::Size_(&local_510,patchSize);
          patchMean_00 = mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_530,"haar",&local_531);
          BinaryReconstructionWithBIHT
                    ((Mat *)&x,(LBDOperator *)LBD_00,local_3d8,(int)iterations_00,sparsityCoeff,
                     &local_510,patchMean_00,2,(string *)local_530);
          std::__cxx11::string::~string(local_530);
          std::allocator<char>::~allocator((allocator<char> *)&local_531);
          cv::Mat::operator()(local_598,(Rect *)_sparsity_local);
          cv::operator+=(local_598,(Mat *)&x);
          cv::Mat::operator()(local_5f8,(Rect *)local_118);
          cv::Mat::operator=(local_598,local_5f8);
          cv::Mat::~Mat(local_5f8);
          cv::operator+=(local_598,(Mat *)local_1a0);
          cv::Mat::~Mat(local_598);
        }
      }
    }
    finalize((Mat *)_sparsity_local,(Mat *)local_118);
    cv::Mat::~Mat((Mat *)&x);
    cv::Mat::~Mat(local_3d8);
    cv::Mat::~Mat(local_378);
    SignOperator::~SignOperator((SignOperator *)local_318);
    cv::Mat::~Mat((Mat *)local_1a0);
    cv::Mat::~Mat((Mat *)local_118);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,"anImage.type() == CV_32F && anImage.channels() == 1",&local_61);
  auVar4 = cv::error(-0xd7,local_60,"PerformBIHTOnImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                     ,0x29f);
  local_74 = auVar4._8_4_;
  local_70 = auVar4._0_8_;
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  _Unwind_Resume(local_70);
}

Assistant:

void lts2::PerformBIHTOnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float sparsity, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image  
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Binarization operator
  SignOperator A;

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);
      A.Apply(freak, freak);

      lts2::BinaryReconstructionWithBIHT(resultPatch, LBD, freak,
                                         iterations, sparsity, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}